

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

SQWeakRef * __thiscall SQRefCounted::GetWeakRef(SQRefCounted *this,SQObjectType type)

{
  SQWeakRef *pSVar1;
  
  if (this->_weakref != (SQWeakRef *)0x0) {
    return this->_weakref;
  }
  pSVar1 = (SQWeakRef *)sq_vm_malloc(0x28);
  this->_weakref = pSVar1;
  (pSVar1->super_SQRefCounted)._uiRef = 0;
  (pSVar1->super_SQRefCounted)._weakref = (SQWeakRef *)0x0;
  (pSVar1->super_SQRefCounted)._vptr_SQRefCounted = (_func_int **)&PTR__SQRefCounted_0013dbd0;
  pSVar1 = this->_weakref;
  (pSVar1->_obj)._type = type;
  (pSVar1->_obj)._unVal.pRefCounted = this;
  return this->_weakref;
}

Assistant:

SQWeakRef *SQRefCounted::GetWeakRef(SQObjectType type)
{
    if(!_weakref) {
        sq_new(_weakref,SQWeakRef);
#if defined(SQUSEDOUBLE) && !defined(_SQ64)
        _weakref->_obj._unVal.raw = 0; //clean the whole union on 32 bits with double
#endif
        _weakref->_obj._type = type;
        _weakref->_obj._unVal.pRefCounted = this;
    }
    return _weakref;
}